

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

double ON_InternalDefuzz(double rel_tol,double x)

{
  ulong uVar1;
  double dVar2;
  double __x;
  
  __x = ABS(x) * 256.0;
  if (255.0 < __x) {
    if (rel_tol <= 8.881784197001252e-16) {
      rel_tol = 8.881784197001252e-16;
    }
    dVar2 = floor(__x);
    uVar1 = -(ulong)(0.5 < __x - dVar2);
    dVar2 = (double)(~uVar1 & (ulong)dVar2 | (ulong)(dVar2 + 1.0) & uVar1);
    if (ABS(__x - dVar2) <= rel_tol * __x) {
      x = (double)(~-(ulong)(x < 0.0) & (ulong)dVar2 | (ulong)-dVar2 & -(ulong)(x < 0.0)) *
          0.00390625;
    }
  }
  return x;
}

Assistant:

static double ON_InternalDefuzz( double rel_tol, double x)
{
  if (!(rel_tol >= 4.0*ON_EPSILON))
    rel_tol = 4.0*ON_EPSILON;
  const double s = 256.0;
  const double a = s*fabs(x);
  if (!(a > 255.0))
    return x;

  double ia = floor(a);
  double fa = a - ia;
  if (fa > 0.5)
    ia += 1.0;
  const double y
    = (fabs(a - ia) <= a*rel_tol)
    ? (((x < 0.0) ? -ia : ia)/s)
    : x;

  return y;
}